

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::SequenceMethod::checkArguments
          (SequenceMethod *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5
          )

{
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  SourceLocation in_RCX;
  ASTContext *in_RDX;
  SystemSubroutine *in_RSI;
  SourceLocation in_RDI;
  SourceLocation in_R8;
  undefined8 in_R9;
  undefined1 isMethod;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  Compilation *comp;
  SequenceMethod *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  size_type *r;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  byte bVar2;
  bitmask<slang::ast::ASTFlags> local_68 [5];
  SourceLocation SVar3;
  Type *local_8;
  
  isMethod = (undefined1)((ulong)in_R9 >> 0x38);
  SVar3 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0x9567ab);
  callRange.endLoc = in_RCX;
  callRange.startLoc = SVar3;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RSI,in_RDX,(bool)isMethod,(Args *)this_00,callRange,unaff_retaddr,
                     in_stack_00000008);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
    checkLocalVars(in_stack_000000a0,(Expression *)range.endLoc,(ASTContext *)range.startLoc,
                   (SourceRange)in_stack_000000a8);
    r = &(in_RSI->name)._M_string_length;
    bitmask<slang::ast::ASTFlags>::bitmask(local_68,AssertionExpr);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (bitmask<slang::ast::ASTFlags> *)r);
    bVar2 = 0;
    if (!bVar1) {
      bVar2 = *(byte *)((long)in_RDI + 0x38);
    }
    if ((bVar2 & 1) == 0) {
      local_8 = Compilation::getBitType(this_00);
    }
    else {
      sourceRange.endLoc = in_R8;
      sourceRange.startLoc = in_RCX;
      ASTContext::addDiag((ASTContext *)in_RDI,(DiagCode)0x25000b,sourceRange);
      local_8 = Compilation::getErrorType(this_00);
    }
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        checkLocalVars(*args[0], context, range);

        if (!context.flags.has(ASTFlags::AssertionExpr) && isMatched) {
            context.addDiag(diag::SequenceMatchedOutsideAssertion, range);
            return comp.getErrorType();
        }

        return comp.getBitType();
    }